

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedForward.h
# Opt level: O0

void kwsys_shared_forward_print_failure(char **argv)

{
  char **local_1020;
  char **arg;
  char msg [4096];
  char **argv_local;
  
  kwsys_shared_forward_strerror((char *)&arg);
  fprintf(_stderr,"Error running");
  for (local_1020 = argv; *local_1020 != (char *)0x0; local_1020 = local_1020 + 1) {
    fprintf(_stderr," \"%s\"",*local_1020);
  }
  fprintf(_stderr,": %s\n",&arg);
  return;
}

Assistant:

static void kwsys_shared_forward_print_failure(char const* const* argv)
{
  char msg[KWSYS_SHARED_FORWARD_MAXPATH];
  char const* const* arg = argv;
  kwsys_shared_forward_strerror(msg);
  fprintf(stderr, "Error running");
  for(; *arg; ++arg)
    {
    fprintf(stderr, " \"%s\"", *arg);
    }
  fprintf(stderr, ": %s\n", msg);
}